

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O2

member_t *
kiste::parse_class_member(member_t *__return_storage_ptr__,parse_context *ctx,string *line)

{
  long lVar1;
  parse_error *ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> member_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> member_class_name;
  
  if (ctx->_class_curly_level == 0) {
    ppVar2 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(ppVar2,"Cannot add a member here, did you forget to call $class?");
  }
  else {
    lVar1 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6);
    if (lVar1 == -1) {
      ppVar2 = (parse_error *)__cxa_allocate_exception(0x10);
      parse_error::parse_error(ppVar2,"Could not find member class name");
    }
    else {
      lVar1 = std::__cxx11::string::find_first_of((char *)line,0x1090d6);
      if (lVar1 != -1) {
        std::__cxx11::string::substr((ulong)&member_class_name,(ulong)line);
        lVar1 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6);
        if (lVar1 == -1) {
          ppVar2 = (parse_error *)__cxa_allocate_exception(0x10);
          parse_error::parse_error(ppVar2,"Could not find member name");
          __cxa_throw(ppVar2,&parse_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::find_first_of((char *)line,0x1090d6);
        std::__cxx11::string::substr((ulong)&member_name,(ulong)line);
        lVar1 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6);
        if (lVar1 == -1) {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,(string *)&member_class_name);
          std::__cxx11::string::string
                    ((string *)&__return_storage_ptr__->name,(string *)&member_name);
          std::__cxx11::string::~string((string *)&member_name);
          std::__cxx11::string::~string((string *)&member_class_name);
          return __return_storage_ptr__;
        }
        ppVar2 = (parse_error *)__cxa_allocate_exception(0x10);
        parse_error::parse_error(ppVar2,"unexpected characters after member declaration");
        __cxa_throw(ppVar2,&parse_error::typeinfo,std::runtime_error::~runtime_error);
      }
      ppVar2 = (parse_error *)__cxa_allocate_exception(0x10);
      parse_error::parse_error(ppVar2,"Could not find member name");
    }
  }
  __cxa_throw(ppVar2,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto parse_class_member(const parse_context& ctx, const std::string& line) -> member_t
  {
    if (not ctx._class_curly_level)
    {
      throw parse_error("Cannot add a member here, did you forget to call $class?");
    }
    const auto classBegin = line.find_first_not_of(" \t", std::strlen("member"));
    if (classBegin == line.npos)
      throw parse_error("Could not find member class name");
    const auto classEnd = line.find_first_of(" \t", classBegin);
    if (classEnd == line.npos)
      throw parse_error("Could not find member name");

    const auto member_class_name = line.substr(classBegin, classEnd - classBegin);

    const auto nameBegin = line.find_first_not_of(" \t", classEnd);
    if (nameBegin == line.npos)
      throw parse_error("Could not find member name");
    const auto nameEnd = line.find_first_of(" \t", nameBegin);

    const auto member_name = (nameEnd == line.npos) ? line.substr(nameBegin)
                                                    : line.substr(nameBegin, nameEnd - nameBegin);

    if (line.find_first_not_of(" \t", nameEnd) != line.npos)
    {
      throw parse_error("unexpected characters after member declaration");
    }

    return {member_class_name, member_name};
  }